

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpacking.cpp
# Opt level: O1

uint32_t * unpack9_8(uint32_t base,uint32_t *in,uint32_t *out)

{
  uint uVar1;
  uint32_t uVar2;
  
  *out = (*in & 0x1ff) + base;
  out[1] = (*in >> 9 & 0x1ff) + base;
  out[2] = (*in >> 0x12 & 0x1ff) + base;
  uVar1 = *in;
  out[3] = uVar1 >> 0x1b;
  out[3] = (uVar1 >> 0x1b) + base + (in[1] & 0xf) * 0x20;
  out[4] = (in[1] >> 4 & 0x1ff) + base;
  out[5] = (in[1] >> 0xd & 0x1ff) + base;
  out[6] = (in[1] >> 0x16 & 0x1ff) + base;
  uVar2 = in[1];
  out[7] = -((int)uVar2 >> 0x1f);
  out[7] = -((int)uVar2 >> 0x1f) + base + (in[2] & 0xff) * 2;
  return in + 3;
}

Assistant:

uint32_t * unpack9_8( uint32_t base,  uint32_t *   in, uint32_t *    out) {

    *out = ( (*in) >>  0  )   % (1U << 9 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  9  )   % (1U << 9 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  18  )   % (1U << 9 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  27  ) ;
    ++in;
    *out |= ((*in) % (1U<< 4 ))<<( 9 - 4 );
    *out += base;
    out++;
    *out = ( (*in) >>  4  )   % (1U << 9 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  13  )   % (1U << 9 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  22  )   % (1U << 9 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  31  ) ;
    ++in;
    *out |= ((*in) % (1U<< 8 ))<<( 9 - 8 );
    *out += base;
    out++;

    return in + 1;
}